

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O3

void __thiscall
mocker::Token::Val<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Val(Val<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ValBase)._vptr_ValBase = (_func_int **)&PTR__Val_001eb920;
  pcVar2 = (this->val)._M_dataplus._M_p;
  paVar1 = &(this->val).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

~Val() override = default;